

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

cmGeneratorTarget * __thiscall
cmLocalGenerator::FindGeneratorTargetToUse(cmLocalGenerator *this,string *name)

{
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  __last;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  _Var1;
  cmGeneratorTarget *pcVar2;
  NamedGeneratorTargetFinder NStack_48;
  
  _Var1._M_current =
       (this->ImportedGeneratorTargets).
       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (this->ImportedGeneratorTargets).
       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::__cxx11::string::string((string *)&NStack_48,(string *)name);
  _Var1 = std::
          find_if<__gnu_cxx::__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,NamedGeneratorTargetFinder>
                    (_Var1,__last,&NStack_48);
  std::__cxx11::string::~string((string *)&NStack_48);
  if (_Var1._M_current ==
      (this->ImportedGeneratorTargets).
      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar2 = FindGeneratorTarget(this,name);
    if (pcVar2 == (cmGeneratorTarget *)0x0) {
      pcVar2 = cmGlobalGenerator::FindGeneratorTarget(this->GlobalGenerator,name);
    }
  }
  else {
    pcVar2 = *_Var1._M_current;
  }
  return pcVar2;
}

Assistant:

cmGeneratorTarget*
cmLocalGenerator::FindGeneratorTargetToUse(const std::string& name) const
{
  std::vector<cmGeneratorTarget*>::const_iterator
    imported = std::find_if(this->ImportedGeneratorTargets.begin(),
                            this->ImportedGeneratorTargets.end(),
                            NamedGeneratorTargetFinder(name));
  if(imported != this->ImportedGeneratorTargets.end())
    {
    return *imported;
    }

  if(cmGeneratorTarget* t = this->FindGeneratorTarget(name))
    {
    return t;
    }

  return this->GetGlobalGenerator()->FindGeneratorTarget(name);
}